

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

int __thiscall
Fl_Table::find_cell(Fl_Table *this,TableContext context,int R,int C,int *X,int *Y,int *W,int *H)

{
  int iVar1;
  long lVar2;
  int *Y_local;
  int *X_local;
  int local_20;
  int C_local;
  int R_local;
  TableContext context_local;
  Fl_Table *this_local;
  
  X_local._4_4_ = C;
  local_20 = R;
  C_local = context;
  _R_local = this;
  iVar1 = row_col_clamp(this,context,&local_20,(int *)((long)&X_local + 4));
  if (iVar1 == 0) {
    lVar2 = col_scroll_position(this,X_local._4_4_);
    iVar1 = Fl_Scrollbar::value(this->hscrollbar);
    *X = ((int)lVar2 - iVar1) + this->tix;
    lVar2 = row_scroll_position(this,local_20);
    iVar1 = Fl_Scrollbar::value(this->vscrollbar);
    *Y = ((int)lVar2 - iVar1) + this->tiy;
    iVar1 = col_width(this,X_local._4_4_);
    *W = iVar1;
    iVar1 = row_height(this,local_20);
    *H = iVar1;
    switch(C_local) {
    case 4:
      *X = this->wix;
      iVar1 = row_header_width(this);
      *W = iVar1;
      this_local._4_4_ = 0;
      break;
    default:
      fprintf(_stderr,"Fl_Table::find_cell: unknown context %d\n",(ulong)(uint)C_local);
      this_local._4_4_ = -1;
      break;
    case 8:
      *Y = this->wiy;
      iVar1 = col_header_height(this);
      *H = iVar1;
      this_local._4_4_ = 0;
      break;
    case 0x10:
      this_local._4_4_ = 0;
      break;
    case 0x20:
      this_local._4_4_ = 0;
    }
  }
  else {
    *H = 0;
    *W = 0;
    *Y = 0;
    *X = 0;
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Table::find_cell(TableContext context, int R, int C, int &X, int &Y, int &W, int &H) {
  if ( row_col_clamp(context, R, C) ) {		// row or col out of range? error
    X=Y=W=H=0;
    return(-1);
  }
  X = col_scroll_position(C) - hscrollbar->value() + tix;
  Y = row_scroll_position(R) - vscrollbar->value() + tiy;
  W = col_width(C);
  H = row_height(R);
  
  switch ( context ) {
    case CONTEXT_COL_HEADER:
      Y = wiy;
      H = col_header_height();
      return(0);
      
    case CONTEXT_ROW_HEADER:
      X = wix;
      W = row_header_width();
      return(0);
      
    case CONTEXT_CELL:
      return(0);
      
    case CONTEXT_TABLE:
      return(0);
      
      // TODO -- HANDLE OTHER CONTEXTS
    default:
      fprintf(stderr, "Fl_Table::find_cell: unknown context %d\n", (int)context);
      return(-1);
  }
  //NOTREACHED
}